

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invoke.cpp
# Opt level: O0

Am_Object am_invoke_window_Initialize(void)

{
  Am_Slot_Key AVar1;
  Am_Object *pAVar2;
  Am_Method_Wrapper *pAVar3;
  Am_Wrapper *pAVar4;
  Am_Constraint *pAVar5;
  Am_Object *pAVar6;
  Am_Value_List *pAVar7;
  Am_Object_Data *in_RDI;
  Am_Object local_300;
  Am_Object local_2f8;
  Am_Object accel_input_widget;
  Am_Object local_2e8;
  Am_Object local_2e0;
  Am_Value_List local_2d8;
  Am_Object local_2c8;
  Am_Object local_2c0;
  Am_Object local_2b8;
  Am_Object local_2b0;
  Am_Object local_2a8;
  Am_Input_Char local_29c;
  Am_Value local_298;
  Am_Object local_288;
  Am_Object local_280;
  Am_Object local_278;
  Am_Input_Char local_26c;
  Am_Value local_268;
  Am_Object local_258;
  Am_Object local_250;
  Am_Object local_248;
  Am_Formula local_240;
  Am_Formula local_230;
  Am_Formula local_220;
  Am_Object local_210;
  Am_Object local_208;
  Am_Object local_200;
  Am_Object sg;
  Am_Object local_1f0;
  Am_Object local_1e8;
  Am_Object local_1e0;
  Am_Object local_1d8;
  Am_Object local_1d0;
  Am_Value local_1c8;
  Am_Object local_1b8;
  Am_Object local_1b0;
  Am_Value_List local_1a8;
  Am_Font local_198;
  Am_Object local_190;
  Am_Object local_188;
  Am_Font local_180;
  Am_Object local_178;
  Am_Object local_170;
  Am_Object local_168;
  Am_Value_List local_160;
  Am_Object local_150;
  Am_Object local_148;
  Am_Object local_140;
  Am_Object local_138;
  Am_Font local_130;
  Am_Object local_128;
  Am_Object local_120;
  Am_Value_List local_118;
  Am_Object local_108;
  Am_Object local_100;
  Am_Object local_f8;
  Am_Object local_f0;
  Am_Font local_e8;
  Am_Object local_e0;
  Am_Object local_d8;
  Am_Object local_d0;
  Am_Formula local_c8;
  Am_Object local_b8;
  Am_Object local_b0;
  Am_Object local_a8;
  Am_Object local_a0;
  Am_Formula local_98;
  Am_Object local_88;
  Am_Object local_80;
  Am_Object local_78;
  Am_Object local_70;
  Am_Font local_68;
  Am_Object local_60;
  Am_Object local_58;
  Am_Object local_50;
  Am_Font local_48;
  Am_Object local_40;
  Am_Object local_38;
  Am_Object local_30 [3];
  Am_Object local_18 [2];
  
  Am_Object::Create(local_18,(char *)&Am_Command);
  pAVar2 = Am_Object::Set(local_18,0x150,"Before_After_Match",0);
  pAVar2 = Am_Object::Add(pAVar2,Am_SHOW_SCRIPT_COMMAND,0,0);
  pAVar2 = Am_Object::Add(pAVar2,Am_COMMANDS_IN_SCRIPT,0,0);
  pAVar2 = Am_Object::Add(pAVar2,Am_COMMANDS_PROTOTYPES,0,0);
  pAVar2 = Am_Object::Add(pAVar2,0xc5,0,0);
  pAVar2 = Am_Object::Add(pAVar2,Am_ORIGINAL_COMMAND_LIST,0,0);
  pAVar2 = Am_Object::Add(pAVar2,Am_PLACEHOLDER_LIST,0,0);
  pAVar2 = Am_Object::Add(pAVar2,Am_PLACEHOLDER_COUNT,0,0);
  pAVar2 = Am_Object::Add(pAVar2,Am_BEFORE_OR_AFTER,0,0);
  pAVar2 = Am_Object::Add(pAVar2,Am_BEFORE_OR_AFTER_COMMAND,0,0);
  pAVar2 = Am_Object::Add(pAVar2,Am_ORIG_COMMAND,0,0);
  pAVar2 = Am_Object::Add(pAVar2,Am_INSTALLED_ON_COMMAND,0,0);
  pAVar2 = Am_Object::Add(pAVar2,Am_WIDGET_FOR_COMMAND,0,0);
  pAVar2 = Am_Object::Add(pAVar2,Am_SCRIPT_EXECUTE_COMMAND,0,0);
  pAVar2 = Am_Object::Add(pAVar2,0xb8,0,0);
  Am_Object::operator=(&Am_Before_After_Match_Command,pAVar2);
  Am_Object::~Am_Object(local_18);
  Am_Object::Create(local_30,(char *)&Am_Window);
  pAVar3 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_
                     (&Am_Default_Pop_Up_Window_Destroy_Method);
  pAVar2 = Am_Object::Set(local_30,0x89,pAVar3,0);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Motif_Light_Green);
  pAVar2 = Am_Object::Set(pAVar2,0x6a,pAVar4,0);
  pAVar2 = Am_Object::Set(pAVar2,0x6c,"How To Invoke Script",0);
  pAVar2 = Am_Object::Set(pAVar2,0x66,0x1d6,0);
  pAVar2 = Am_Object::Set(pAVar2,0x67,0x15e,0);
  pAVar2 = Am_Object::Add(pAVar2,Am_INVOKE_MATCH_COMMAND,0,0);
  pAVar2 = Am_Object::Add(pAVar2,Am_SCRIPT_WINDOW,0,0);
  Am_Object::operator=(&am_invoke_window,pAVar2);
  Am_Object::~Am_Object(local_30);
  Am_Object::Create(&local_40,(char *)&Am_Text);
  pAVar2 = Am_Object::Set(&local_40,100,6,0);
  pAVar2 = Am_Object::Set(pAVar2,0x65,0xb,0);
  pAVar2 = Am_Object::Set(pAVar2,0xab,"Specify how to invoke the script:",0);
  Am_Font::Am_Font(&local_48,Am_FONT_FIXED,true,false,false,Am_FONT_LARGE);
  pAVar4 = Am_Font::operator_cast_to_Am_Wrapper_(&local_48);
  pAVar2 = Am_Object::Set(pAVar2,0xac,pAVar4,0);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Black);
  pAVar2 = Am_Object::Set(pAVar2,0x6b,pAVar4,0);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_No_Style);
  pAVar2 = Am_Object::Set(pAVar2,0x6a,pAVar4,0);
  Am_Object::Am_Object(&local_38,pAVar2);
  Am_Object::Add_Part(&am_invoke_window,&local_38,true,0);
  Am_Object::~Am_Object(&local_38);
  Am_Font::~Am_Font(&local_48);
  Am_Object::~Am_Object(&local_40);
  AVar1 = Am_DO_ACCELERATOR;
  Am_Object::Create(&local_60,(char *)&Am_Checkbox);
  pAVar2 = Am_Object::Set(&local_60,100,0xf,0);
  pAVar2 = Am_Object::Set(pAVar2,0x65,0x2a,0);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Motif_Light_Green);
  pAVar2 = Am_Object::Set(pAVar2,0x6a,pAVar4,0);
  Am_Font::Am_Font(&local_68,Am_FONT_FIXED,true,false,false,Am_FONT_MEDIUM);
  pAVar4 = Am_Font::operator_cast_to_Am_Wrapper_(&local_68);
  pAVar2 = Am_Object::Set(pAVar2,0xac,pAVar4,0);
  Am_Object::Get_Object(&local_58,(Am_Slot_Key)pAVar2,0xc5);
  pAVar2 = Am_Object::Set(&local_58,0x150,"Accelerator Key:",0);
  pAVar2 = Am_Object::Set(pAVar2,0x153,true,0);
  Am_Object::Get_Owner(&local_50,(Am_Slot_Flags)pAVar2);
  pAVar2 = Am_Object::Add_Part(&am_invoke_window,AVar1,&local_50,0);
  Am_Object::Create(&local_88,(char *)&Am_Text_Input_Widget);
  Am_Right_Of_Sibling((Am_Slot_Key)&local_98,(uint)Am_DO_ACCELERATOR,1.0);
  pAVar5 = Am_Formula::operator_cast_to_Am_Constraint_(&local_98);
  pAVar6 = Am_Object::Set(&local_88,100,pAVar5,0);
  pAVar6 = Am_Object::Set(pAVar6,0x65,0x28,0);
  pAVar6 = Am_Object::Set(pAVar6,0x66,100,0);
  pAVar6 = Am_Object::Set(pAVar6,0x67,0x19,0);
  Am_Object::Get_Object(&local_80,(Am_Slot_Key)pAVar6,0xc5);
  pAVar6 = Am_Object::Set(&local_80,0x150,"",0);
  Am_Object::Get_Owner(&local_78,(Am_Slot_Flags)pAVar6);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Motif_Light_Green);
  pAVar6 = Am_Object::Set(&local_78,0x6a,pAVar4,0);
  Am_Object::Am_Object(&local_70,pAVar6);
  Am_Object::Add_Part(pAVar2,0x152,&local_70,0);
  Am_Object::~Am_Object(&local_70);
  Am_Object::~Am_Object(&local_78);
  Am_Object::~Am_Object(&local_80);
  Am_Formula::~Am_Formula(&local_98);
  Am_Object::~Am_Object(&local_88);
  Am_Object::~Am_Object(&local_50);
  Am_Object::~Am_Object(&local_58);
  Am_Font::~Am_Font(&local_68);
  Am_Object::~Am_Object(&local_60);
  Am_Object::Create(&local_b8,(char *)&Am_Button);
  Am_Right_Of_Sibling((Am_Slot_Key)&local_c8,0x152,1.0);
  pAVar5 = Am_Formula::operator_cast_to_Am_Constraint_(&local_c8);
  pAVar2 = Am_Object::Set(&local_b8,100,pAVar5,0);
  pAVar2 = Am_Object::Set(pAVar2,0x65,0x28,0);
  pAVar2 = Am_Object::Set(pAVar2,0x1c7,false,0);
  Am_Object::Get_Object(&local_b0,(Am_Slot_Key)pAVar2,0xc5);
  pAVar2 = Am_Object::Set(&local_b0,0x150,"None",0);
  pAVar3 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&clear_accel);
  pAVar2 = Am_Object::Set(pAVar2,0xca,pAVar3,0);
  Am_Object::Get_Owner(&local_a8,(Am_Slot_Flags)pAVar2);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Motif_Light_Green);
  pAVar2 = Am_Object::Set(&local_a8,0x6a,pAVar4,0);
  Am_Object::Am_Object(&local_a0,pAVar2);
  Am_Object::Add_Part(&am_invoke_window,&local_a0,true,0);
  Am_Object::~Am_Object(&local_a0);
  Am_Object::~Am_Object(&local_a8);
  Am_Object::~Am_Object(&local_b0);
  Am_Formula::~Am_Formula(&local_c8);
  Am_Object::~Am_Object(&local_b8);
  AVar1 = Am_DO_MENU;
  Am_Object::Create(&local_e0,(char *)&Am_Checkbox);
  pAVar2 = Am_Object::Set(&local_e0,100,0xf,0);
  pAVar2 = Am_Object::Set(pAVar2,0x65,0x50,0);
  Am_Font::Am_Font(&local_e8,Am_FONT_FIXED,true,false,false,Am_FONT_MEDIUM);
  pAVar4 = Am_Font::operator_cast_to_Am_Wrapper_(&local_e8);
  pAVar2 = Am_Object::Set(pAVar2,0xac,pAVar4,0);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Motif_Light_Green);
  pAVar2 = Am_Object::Set(pAVar2,0x6a,pAVar4,0);
  pAVar2 = Am_Object::Set(pAVar2,0x17d,false,0);
  Am_Object::Get_Object(&local_d8,(Am_Slot_Key)pAVar2,0xc5);
  pAVar2 = Am_Object::Set(&local_d8,0x150,"In Application Menu:",0);
  pAVar2 = Am_Object::Set(pAVar2,0x153,true,0);
  Am_Object::Get_Owner(&local_d0,(Am_Slot_Flags)pAVar2);
  Am_Object::Add_Part(&am_invoke_window,AVar1,&local_d0,0);
  Am_Object::~Am_Object(&local_d0);
  Am_Object::~Am_Object(&local_d8);
  Am_Font::~Am_Font(&local_e8);
  Am_Object::~Am_Object(&local_e0);
  AVar1 = Am_WHICH_APPL_MENU;
  Am_Object::Create(&local_108,(char *)&Am_Option_Button);
  pAVar2 = Am_Object::Set(&local_108,100,0xb4,0);
  pAVar2 = Am_Object::Set(pAVar2,0x65,0x4b,0);
  pAVar2 = Am_Object::Set(pAVar2,0x17d,false,0);
  Am_Value_List::Am_Value_List(&local_118);
  pAVar7 = Am_Value_List::Add(&local_118,"File",Am_TAIL,true);
  pAVar7 = Am_Value_List::Add(pAVar7,"Edit",Am_TAIL,true);
  pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_(pAVar7);
  pAVar2 = Am_Object::Set(pAVar2,0xa2,pAVar4,0);
  Am_Object::Get_Object(&local_100,(Am_Slot_Key)pAVar2,0xc5);
  pAVar3 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&do_top_menu_selected);
  pAVar2 = Am_Object::Set(&local_100,0xca,pAVar3,0);
  Am_Object::Get_Owner(&local_f8,(Am_Slot_Flags)pAVar2);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Motif_Light_Green);
  pAVar2 = Am_Object::Set(&local_f8,0x6a,pAVar4,0);
  Am_Object::Am_Object(&local_f0,pAVar2);
  Am_Object::Add_Part(&am_invoke_window,AVar1,&local_f0,0);
  Am_Object::~Am_Object(&local_f0);
  Am_Object::~Am_Object(&local_f8);
  Am_Object::~Am_Object(&local_100);
  Am_Value_List::~Am_Value_List(&local_118);
  Am_Object::~Am_Object(&local_108);
  Am_Object::Create(&local_128,(char *)&Am_Text);
  pAVar2 = Am_Object::Set(&local_128,100,0x2d,0);
  pAVar2 = Am_Object::Set(pAVar2,0x65,0x73,0);
  Am_Font::Am_Font(&local_130,Am_FONT_FIXED,true,false,false,Am_FONT_MEDIUM);
  pAVar4 = Am_Font::operator_cast_to_Am_Wrapper_(&local_130);
  pAVar2 = Am_Object::Set(pAVar2,0xac,pAVar4,0);
  pAVar2 = Am_Object::Set(pAVar2,0xab,"Before Sub-Menu Item:",0);
  Am_Object::Am_Object(&local_120,pAVar2);
  Am_Object::Add_Part(&am_invoke_window,&local_120,true,0);
  Am_Object::~Am_Object(&local_120);
  Am_Font::~Am_Font(&local_130);
  Am_Object::~Am_Object(&local_128);
  AVar1 = Am_WHICH_APPL_SUB_MENU;
  Am_Object::Create(&local_150,(char *)&Am_Option_Button);
  pAVar2 = Am_Object::Set(&local_150,100,0xc3,0);
  pAVar2 = Am_Object::Set(pAVar2,0x65,0x6e,0);
  pAVar2 = Am_Object::Set(pAVar2,0x17d,false,0);
  Am_Value_List::Am_Value_List(&local_160);
  pAVar7 = Am_Value_List::Add(&local_160,"<At end>",Am_TAIL,true);
  pAVar7 = Am_Value_List::Add(pAVar7,"<At top>",Am_TAIL,true);
  pAVar7 = Am_Value_List::Add(pAVar7,"Open",Am_TAIL,true);
  pAVar7 = Am_Value_List::Add(pAVar7,"Close",Am_TAIL,true);
  pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_(pAVar7);
  pAVar2 = Am_Object::Set(pAVar2,0xa2,pAVar4,0);
  Am_Object::Get_Object(&local_148,(Am_Slot_Key)pAVar2,0xc5);
  Am_Object::Get_Owner(&local_140,(Am_Slot_Flags)&local_148);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Motif_Light_Green);
  pAVar2 = Am_Object::Set(&local_140,0x6a,pAVar4,0);
  Am_Object::Am_Object(&local_138,pAVar2);
  Am_Object::Add_Part(&am_invoke_window,AVar1,&local_138,0);
  Am_Object::~Am_Object(&local_138);
  Am_Object::~Am_Object(&local_140);
  Am_Object::~Am_Object(&local_148);
  Am_Value_List::~Am_Value_List(&local_160);
  Am_Object::~Am_Object(&local_150);
  Am_Object::Create(&local_178,(char *)&Am_Checkbox);
  pAVar2 = Am_Object::Set(&local_178,100,0xf,0);
  pAVar2 = Am_Object::Set(pAVar2,0x65,0x8c,0);
  Am_Font::Am_Font(&local_180,Am_FONT_FIXED,true,false,false,Am_FONT_MEDIUM);
  pAVar4 = Am_Font::operator_cast_to_Am_Wrapper_(&local_180);
  pAVar2 = Am_Object::Set(pAVar2,0xac,pAVar4,0);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Motif_Light_Green);
  pAVar2 = Am_Object::Set(pAVar2,0x6a,pAVar4,0);
  pAVar2 = Am_Object::Set(pAVar2,0xcc,false,0);
  Am_Object::Get_Object(&local_170,(Am_Slot_Key)pAVar2,0xc5);
  pAVar2 = Am_Object::Set(&local_170,0x150,"At time...",0);
  pAVar2 = Am_Object::Set(pAVar2,0x153,true,0);
  Am_Object::Get_Owner(&local_168,(Am_Slot_Flags)pAVar2);
  Am_Object::Add_Part(&am_invoke_window,&local_168,true,0);
  Am_Object::~Am_Object(&local_168);
  Am_Object::~Am_Object(&local_170);
  Am_Font::~Am_Font(&local_180);
  Am_Object::~Am_Object(&local_178);
  AVar1 = Am_BEFORE_OR_AFTER;
  Am_Object::Create(&local_190,(char *)&Am_Checkbox_Panel);
  pAVar2 = Am_Object::Set(&local_190,100,0xf,0);
  pAVar2 = Am_Object::Set(pAVar2,0x65,0xaa,0);
  Am_Font::Am_Font(&local_198,Am_FONT_FIXED,true,false,false,Am_FONT_MEDIUM);
  pAVar4 = Am_Font::operator_cast_to_Am_Wrapper_(&local_198);
  pAVar2 = Am_Object::Set(pAVar2,0xac,pAVar4,0);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Motif_Light_Green);
  pAVar2 = Am_Object::Set(pAVar2,0x6a,pAVar4,0);
  Am_Value_List::Am_Value_List(&local_1a8);
  Am_Object::Create(&local_1b0,(char *)&Am_Command);
  pAVar6 = Am_Object::Set(&local_1b0,0x150,"After Command",0);
  pAVar6 = Am_Object::Set(pAVar6,0x153,0x34,0);
  pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar6);
  pAVar7 = Am_Value_List::Add(&local_1a8,pAVar4,Am_TAIL,true);
  Am_Object::Create(&local_1b8,(char *)&Am_Command);
  pAVar6 = Am_Object::Set(&local_1b8,0x150,"Before Command",0);
  pAVar6 = Am_Object::Set(pAVar6,0x153,0x33,0);
  pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar6);
  pAVar7 = Am_Value_List::Add(pAVar7,pAVar4,Am_TAIL,true);
  pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_(pAVar7);
  pAVar2 = Am_Object::Set(pAVar2,0xa2,pAVar4,0);
  pAVar5 = Am_Formula::operator_cast_to_Am_Constraint_(&Am_Vertical_Layout);
  pAVar2 = Am_Object::Set(pAVar2,0x94,pAVar5,0);
  Am_Choice_How_Set::operator_cast_to_Am_Value((Am_Choice_How_Set *)&local_1c8);
  pAVar2 = Am_Object::Set(pAVar2,0xd4,&local_1c8,0);
  pAVar2 = Am_Object::Set(pAVar2,0x95,0,0);
  pAVar2 = Am_Object::Set(pAVar2,0x96,0,0);
  pAVar2 = Am_Object::Set(pAVar2,0x9c,0,0);
  Am_Object::Am_Object(&local_188,pAVar2);
  Am_Object::Add_Part(&am_invoke_window,AVar1,&local_188,0);
  Am_Object::~Am_Object(&local_188);
  Am_Value::~Am_Value(&local_1c8);
  Am_Object::~Am_Object(&local_1b8);
  Am_Object::~Am_Object(&local_1b0);
  Am_Value_List::~Am_Value_List(&local_1a8);
  Am_Font::~Am_Font(&local_198);
  Am_Object::~Am_Object(&local_190);
  AVar1 = Am_COMMAND_LOAD_BUTTON;
  Am_Object::Create(&local_1e0,(char *)&Am_Button);
  pAVar2 = Am_Object::Set(&local_1e0,100,0x91,0);
  pAVar2 = Am_Object::Set(pAVar2,0x65,0xb9,0);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Motif_Light_Green);
  pAVar2 = Am_Object::Set(pAVar2,0x6a,pAVar4,0);
  pAVar2 = Am_Object::Set(pAVar2,0x1c7,false,0);
  pAVar5 = Am_Formula::operator_cast_to_Am_Constraint_(&am_before_or_after_picked);
  pAVar2 = Am_Object::Set(pAVar2,0xcc,pAVar5,0);
  Am_Object::Get_Object(&local_1d8,(Am_Slot_Key)pAVar2,0xc5);
  pAVar2 = Am_Object::Set(&local_1d8,0x150,"Load",0);
  pAVar3 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&am_load_current_command_from_main)
  ;
  pAVar2 = Am_Object::Set(pAVar2,0xca,pAVar3,0);
  Am_Object::Get_Owner(&local_1d0,(Am_Slot_Flags)pAVar2);
  Am_Object::Add_Part(&am_invoke_window,AVar1,&local_1d0,0);
  Am_Object::~Am_Object(&local_1d0);
  Am_Object::~Am_Object(&local_1d8);
  Am_Object::~Am_Object(&local_1e0);
  AVar1 = Am_COMMAND_GENERALIZE_BUTTON;
  Am_Object::Create(&sg,(char *)&Am_Button);
  pAVar2 = Am_Object::Set(&sg,100,0x122,0);
  pAVar2 = Am_Object::Set(pAVar2,0x65,0xbe,0);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Motif_Light_Green);
  pAVar2 = Am_Object::Set(pAVar2,0x6a,pAVar4,0);
  pAVar2 = Am_Object::Set(pAVar2,0x1c7,false,0);
  Am_Object::Get_Object(&local_1f0,(Am_Slot_Key)pAVar2,0xc5);
  pAVar2 = Am_Object::Set(&local_1f0,0x150,"Generalize",0);
  pAVar3 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&am_pop_up_generalize_from_button);
  pAVar2 = Am_Object::Set(pAVar2,0xca,pAVar3,0);
  pAVar5 = Am_Formula::operator_cast_to_Am_Constraint_(&am_generalize_script_active);
  pAVar2 = Am_Object::Set(pAVar2,0xcc,pAVar5,0);
  Am_Object::Get_Owner(&local_1e8,(Am_Slot_Flags)pAVar2);
  Am_Object::Add_Part(&am_invoke_window,AVar1,&local_1e8,0);
  Am_Object::~Am_Object(&local_1e8);
  Am_Object::~Am_Object(&local_1f0);
  Am_Object::~Am_Object(&sg);
  Am_Object::Am_Object(&local_200);
  AVar1 = Am_UNDO_SCROLL_GROUP;
  Am_Object::Create(&local_210,(char *)&Am_Scrolling_Menu);
  pAVar2 = Am_Object::Set(&local_210,100,0xf,0);
  Am_Bottom_Of_Sibling((Am_Slot_Key)&local_220,(uint)Am_BEFORE_OR_AFTER,1.0);
  pAVar5 = Am_Formula::operator_cast_to_Am_Constraint_(&local_220);
  pAVar2 = Am_Object::Set(pAVar2,0x65,pAVar5,0);
  Am_From_Owner((Am_Slot_Key)&local_230,0x66,1.0);
  pAVar5 = Am_Formula::operator_cast_to_Am_Constraint_(&local_230);
  pAVar2 = Am_Object::Set(pAVar2,0x66,pAVar5,0);
  Am_Rest_Of_Height_Above((Am_Slot_Key)&local_240,(uint)Am_UNDO_OPTIONS);
  pAVar5 = Am_Formula::operator_cast_to_Am_Constraint_(&local_240);
  pAVar2 = Am_Object::Set(pAVar2,0x67,pAVar5,0);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Motif_Light_Green);
  pAVar2 = Am_Object::Set(pAVar2,0x6a,pAVar4,0);
  pAVar2 = Am_Object::Set(pAVar2,0x18a,true,0);
  Am_Object::Create(&local_258,(char *)&Am_One_Shot_Interactor);
  Am_Input_Char::Am_Input_Char(&local_26c,"left_down",true);
  Am_Input_Char::operator_cast_to_Am_Value((Am_Input_Char *)&local_268);
  pAVar6 = Am_Object::Set(&local_258,0xb9,&local_268,0);
  pAVar6 = Am_Object::Set(pAVar6,0xcd,10.0,0);
  pAVar3 = Am_Where_Method::operator_cast_to_Am_Method_Wrapper_(&am_on_selectable_match_line_part);
  pAVar6 = Am_Object::Set(pAVar6,0xba,pAVar3,0);
  Am_Object::Get_Object(&local_250,(Am_Slot_Key)pAVar6,0xc5);
  pAVar3 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&am_select_line_part);
  pAVar6 = Am_Object::Set(&local_250,0xca,pAVar3,0);
  pAVar6 = Am_Object::Set(pAVar6,0x154,-1,0);
  Am_Object::Get_Owner(&local_248,(Am_Slot_Flags)pAVar6);
  pAVar2 = Am_Object::Add_Part(pAVar2,0x1ac,&local_248,0);
  Am_Object::Create(&local_288,(char *)&Am_One_Shot_Interactor);
  Am_Input_Char::Am_Input_Char(&local_29c,"double_left_down",true);
  Am_Input_Char::operator_cast_to_Am_Value((Am_Input_Char *)&local_298);
  pAVar6 = Am_Object::Set(&local_288,0xb9,&local_298,0);
  pAVar6 = Am_Object::Set(pAVar6,0xcd,10.0,0);
  pAVar3 = Am_Where_Method::operator_cast_to_Am_Method_Wrapper_(&am_on_selectable_match_line_part);
  pAVar6 = Am_Object::Set(pAVar6,0xba,pAVar3,0);
  Am_Object::Get_Object(&local_280,(Am_Slot_Key)pAVar6,0xc5);
  pAVar3 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&am_generalize_match_double_click);
  pAVar6 = Am_Object::Set(&local_280,0xca,pAVar3,0);
  pAVar6 = Am_Object::Set(pAVar6,0x154,-1,0);
  Am_Object::Get_Owner(&local_278,(Am_Slot_Flags)pAVar6);
  pAVar2 = Am_Object::Add_Part(pAVar2,0x1b8,&local_278,0);
  pAVar2 = Am_Object::operator=(&local_200,pAVar2);
  Am_Object::Am_Object(&local_208,pAVar2);
  Am_Object::Add_Part(&am_invoke_window,AVar1,&local_208,0);
  Am_Object::~Am_Object(&local_208);
  Am_Object::~Am_Object(&local_278);
  Am_Object::~Am_Object(&local_280);
  Am_Value::~Am_Value(&local_298);
  Am_Object::~Am_Object(&local_288);
  Am_Object::~Am_Object(&local_248);
  Am_Object::~Am_Object(&local_250);
  Am_Value::~Am_Value(&local_268);
  Am_Object::~Am_Object(&local_258);
  Am_Formula::~Am_Formula(&local_240);
  Am_Formula::~Am_Formula(&local_230);
  Am_Formula::~Am_Formula(&local_220);
  Am_Object::~Am_Object(&local_210);
  Am_Object::Get_Object(&local_2b0,(Am_Slot_Key)&local_200,0x1d2);
  pAVar2 = Am_Object::Set(&local_2b0,0x96,-4,0);
  pAVar5 = Am_Formula::operator_cast_to_Am_Constraint_(&menu_vis_if_before_after);
  pAVar2 = Am_Object::Set(pAVar2,0x69,pAVar5,0);
  pAVar2 = Am_Object::Set(pAVar2,0x17d,false,0);
  Am_Object::Get_Object(&local_2a8,(Am_Slot_Key)pAVar2,0xa5);
  Am_Object::Set(&local_2a8,0x84,false,0);
  Am_Object::~Am_Object(&local_2a8);
  Am_Object::~Am_Object(&local_2b0);
  Am_Object::Get_Object(&local_2b8,(Am_Slot_Key)&local_200,0xc5);
  pAVar3 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&am_clear_select_line_part);
  Am_Object::Set(&local_2b8,0xca,pAVar3,0);
  Am_Object::~Am_Object(&local_2b8);
  AVar1 = Am_UNDO_OPTIONS;
  Am_Object::Create(&local_2c8,(char *)&Am_Button_Panel);
  pAVar5 = Am_Formula::operator_cast_to_Am_Constraint_(&Am_Center_X_Is_Center_Of_Owner);
  pAVar2 = Am_Object::Set(&local_2c8,100,pAVar5,0);
  pAVar2 = Am_Object::Set(pAVar2,0xa1,10,0);
  pAVar5 = Am_Formula::operator_cast_to_Am_Constraint_(&Am_Bottom_Is_Bottom_Of_Owner);
  pAVar2 = Am_Object::Set(pAVar2,0x65,pAVar5,0);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Motif_Light_Green);
  pAVar2 = Am_Object::Set(pAVar2,0x6a,pAVar4,0);
  pAVar5 = Am_Formula::operator_cast_to_Am_Constraint_(&Am_Horizontal_Layout);
  pAVar2 = Am_Object::Set(pAVar2,0x94,pAVar5,0);
  pAVar2 = Am_Object::Set(pAVar2,0x95,0x14,0);
  pAVar2 = Am_Object::Set(pAVar2,0x96,0,0);
  pAVar2 = Am_Object::Set(pAVar2,0x9c,0,0);
  Am_Value_List::Am_Value_List(&local_2d8);
  Am_Object::Create(&local_2e0,(char *)&Am_Standard_OK_Command);
  pAVar3 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&am_invoke_ok);
  pAVar6 = Am_Object::Set(&local_2e0,0xca,pAVar3,0);
  pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar6);
  pAVar7 = Am_Value_List::Add(&local_2d8,pAVar4,Am_TAIL,true);
  Am_Object::Create(&local_2e8,(char *)&Am_Standard_Cancel_Command);
  pAVar3 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&am_invoke_cancel);
  pAVar6 = Am_Object::Set(&local_2e8,0xca,pAVar3,0);
  pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar6);
  pAVar7 = Am_Value_List::Add(pAVar7,pAVar4,Am_TAIL,true);
  pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_(pAVar7);
  pAVar2 = Am_Object::Set(pAVar2,0xa2,pAVar4,0);
  Am_Object::Am_Object(&local_2c0,pAVar2);
  Am_Object::Add_Part(&am_invoke_window,AVar1,&local_2c0,0);
  Am_Object::~Am_Object(&local_2c0);
  Am_Object::~Am_Object(&local_2e8);
  Am_Object::~Am_Object(&local_2e0);
  Am_Value_List::~Am_Value_List(&local_2d8);
  Am_Object::~Am_Object(&local_2c8);
  Am_Object::Create(&accel_input_widget,(char *)&Am_Tab_To_Next_Widget_Interactor);
  Am_Object::Add_Part(&am_invoke_window,&accel_input_widget,true,0);
  Am_Object::~Am_Object(&accel_input_widget);
  Am_Object::Get_Object(&local_2f8,0x3a60,0x152);
  Am_Object::Get_Object(&local_300,(Am_Slot_Key)&local_2f8,0x1ac);
  pAVar2 = Am_Object::Set_Name(&local_300,(char *)0x0);
  pAVar2 = Am_Object::Set(pAVar2,0xbd,0,0);
  pAVar3 = Am_Text_Edit_Method::operator_cast_to_Am_Method_Wrapper_(&single_char_method);
  Am_Object::Set(pAVar2,0xe3,pAVar3,0);
  Am_Object::~Am_Object(&local_300);
  Am_Object::Am_Object((Am_Object *)in_RDI,&am_invoke_window);
  Am_Object::~Am_Object(&local_2f8);
  Am_Object::~Am_Object(&local_200);
  return (Am_Object)in_RDI;
}

Assistant:

Am_Object
am_invoke_window_Initialize()
{

  Am_Before_After_Match_Command =
      Am_Command.Create(DSTR("Am_Before_After_Match_Command"))
          .Set(Am_LABEL, "Before_After_Match")
          .Add(Am_SHOW_SCRIPT_COMMAND, (0L))
          .Add(Am_COMMANDS_IN_SCRIPT, (0L))
          .Add(Am_COMMANDS_PROTOTYPES, (0L))
          .Add(Am_COMMAND, (0L))
          .Add(Am_ORIGINAL_COMMAND_LIST, (0L))
          .Add(Am_PLACEHOLDER_LIST, (0L))
          .Add(Am_PLACEHOLDER_COUNT, (0L))

          .Add(Am_BEFORE_OR_AFTER, (0L))
          .Add(Am_BEFORE_OR_AFTER_COMMAND, (0L))
          .Add(Am_ORIG_COMMAND, (0L))
          .Add(Am_INSTALLED_ON_COMMAND, (0L))
          .Add(Am_WIDGET_FOR_COMMAND, (0L))
          .Add(Am_SCRIPT_EXECUTE_COMMAND, (0L))
          .Add(Am_SLOTS_TO_SAVE, (0L));
  am_invoke_window = Am_Window.Create(DSTR("script_invoke"))
                         .Set(Am_DESTROY_WINDOW_METHOD,
                              Am_Default_Pop_Up_Window_Destroy_Method)
                         .Set(Am_FILL_STYLE, Am_Motif_Light_Green)
                         .Set(Am_TITLE, "How To Invoke Script")
                         .Set(Am_WIDTH, 470)
                         .Set(Am_HEIGHT, 350)

                         .Add(Am_INVOKE_MATCH_COMMAND, (0L))
                         .Add(Am_SCRIPT_WINDOW, (0L));
  am_invoke_window.Add_Part(
      Am_Text.Create(DSTR("main_title"))
          .Set(Am_LEFT, 6)
          .Set(Am_TOP, 11)
          .Set(Am_TEXT, "Specify how to invoke the script:")
          .Set(Am_FONT,
               Am_Font(Am_FONT_FIXED, true, false, false, Am_FONT_LARGE))
          .Set(Am_LINE_STYLE, Am_Black)
          .Set(Am_FILL_STYLE, Am_No_Style));
  am_invoke_window
      .Add_Part(Am_DO_ACCELERATOR,
                Am_Checkbox.Create(DSTR("Am_DO_ACCEL"))
                    .Set(Am_LEFT, 15)
                    .Set(Am_TOP, 42)
                    .Set(Am_FILL_STYLE, Am_Motif_Light_Green)
                    .Set(Am_FONT, Am_Font(Am_FONT_FIXED, true))
                    .Get_Object(Am_COMMAND)
                    .Set(Am_LABEL, "Accelerator Key:")
                    .Set(Am_ID, true)
                    .Get_Owner())
      .Add_Part(Am_ACCELERATOR,
                Am_Text_Input_Widget.Create(DSTR("accel_string"))
                    .Set(Am_LEFT, Am_Right_Of_Sibling(Am_DO_ACCELERATOR, 5))
                    .Set(Am_TOP, 40)
                    .Set(Am_WIDTH, 100)
                    .Set(Am_HEIGHT, 25)
                    .Get_Object(Am_COMMAND)
                    .Set(Am_LABEL, "")
                    .Get_Owner()
                    .Set(Am_FILL_STYLE, Am_Motif_Light_Green));
  am_invoke_window.Add_Part(
      Am_Button.Create(DSTR("no_accel"))
          .Set(Am_LEFT, Am_Right_Of_Sibling(Am_ACCELERATOR, 5))
          .Set(Am_TOP, 40)
          .Set(Am_LEAVE_ROOM_FOR_FRINGE, false)
          .Get_Object(Am_COMMAND)
          .Set(Am_LABEL, "None")
          .Set(Am_DO_METHOD, clear_accel)
          .Get_Owner()
          .Set(Am_FILL_STYLE, Am_Motif_Light_Green));
  am_invoke_window.Add_Part(Am_DO_MENU,
                            Am_Checkbox.Create(DSTR("Am_DO_MENU"))
                                .Set(Am_LEFT, 15)
                                .Set(Am_TOP, 80)
                                .Set(Am_FONT, Am_Font(Am_FONT_FIXED, true))
                                .Set(Am_FILL_STYLE, Am_Motif_Light_Green)
                                .Set(Am_ACTIVE_2, false) //NIY ***
                                .Get_Object(Am_COMMAND)
                                .Set(Am_LABEL, "In Application Menu:")
                                .Set(Am_ID, true)
                                .Get_Owner());
  am_invoke_window.Add_Part(Am_WHICH_APPL_MENU,
                            Am_Option_Button.Create(DSTR("which_menu"))
                                .Set(Am_LEFT, 180)
                                .Set(Am_TOP, 75)
                                .Set(Am_ACTIVE_2, false) //NIY ***
                                .Set(Am_ITEMS,           //**** TEMP
                                     Am_Value_List().Add("File").Add("Edit")

                                         )
                                .Get_Object(Am_COMMAND)
                                .Set(Am_DO_METHOD, do_top_menu_selected)
                                .Get_Owner()
                                .Set(Am_FILL_STYLE, Am_Motif_Light_Green));
  am_invoke_window.Add_Part(Am_Text.Create(DSTR("before_item_text"))
                                .Set(Am_LEFT, 45)
                                .Set(Am_TOP, 115)
                                .Set(Am_FONT, Am_Font(Am_FONT_FIXED, true))
                                .Set(Am_TEXT, "Before Sub-Menu Item:"));
  am_invoke_window.Add_Part(Am_WHICH_APPL_SUB_MENU,
                            Am_Option_Button.Create(DSTR("which_sub_menu"))
                                .Set(Am_LEFT, 195)
                                .Set(Am_TOP, 110)
                                .Set(Am_ACTIVE_2, false) //NIY ***
                                .Set(Am_ITEMS,           //**** TEMP
                                     Am_Value_List()
                                         .Add("<At end>")
                                         .Add("<At top>")
                                         .Add("Open")
                                         .Add("Close"))
                                .Get_Object(Am_COMMAND)
                                .Get_Owner()
                                .Set(Am_FILL_STYLE, Am_Motif_Light_Green));
  am_invoke_window.Add_Part(Am_Checkbox.Create(DSTR("time"))
                                .Set(Am_LEFT, 15)
                                .Set(Am_TOP, 140)
                                .Set(Am_FONT, Am_Font(Am_FONT_FIXED, true))
                                .Set(Am_FILL_STYLE, Am_Motif_Light_Green)
                                .Set(Am_ACTIVE, false) //NIY ***
                                .Get_Object(Am_COMMAND)
                                .Set(Am_LABEL, "At time...")
                                .Set(Am_ID, true)
                                .Get_Owner());
  am_invoke_window.Add_Part(
      Am_BEFORE_OR_AFTER,
      Am_Checkbox_Panel.Create(DSTR("BEFORE_OR_AFTER"))
          .Set(Am_LEFT, 15)
          .Set(Am_TOP, 170)
          .Set(Am_FONT, Am_Font(Am_FONT_FIXED, true))
          .Set(Am_FILL_STYLE, Am_Motif_Light_Green)
          .Set(Am_ITEMS, Am_Value_List()
                             .Add(Am_Command.Create()
                                      .Set(Am_LABEL, "After Command")
                                      .Set(Am_ID, am_after_command))
                             .Add(Am_Command.Create()
                                      .Set(Am_LABEL, "Before Command")
                                      .Set(Am_ID, am_before_command)))
          .Set(Am_LAYOUT, Am_Vertical_Layout)
          .Set(Am_HOW_SET, Am_CHOICE_TOGGLE)
          .Set(Am_H_SPACING, 0)
          .Set(Am_V_SPACING, 0)
          .Set(Am_MAX_RANK, 0));
  am_invoke_window.Add_Part(
      Am_COMMAND_LOAD_BUTTON,
      Am_Button.Create(DSTR("Am_LOAD_BUTTON"))
          .Set(Am_LEFT, 145)
          .Set(Am_TOP, 185)
          .Set(Am_FILL_STYLE, Am_Motif_Light_Green)
          .Set(Am_LEAVE_ROOM_FOR_FRINGE, false)
          .Set(Am_ACTIVE, am_before_or_after_picked)
          .Get_Object(Am_COMMAND)
          .Set(Am_LABEL, "Load")
          .Set(Am_DO_METHOD, am_load_current_command_from_main)
          .Get_Owner());
  am_invoke_window.Add_Part(
      Am_COMMAND_GENERALIZE_BUTTON,
      Am_Button.Create(DSTR("Am_COMMAND_GENERALIZE_BUTTON"))
          .Set(Am_LEFT, 290)
          .Set(Am_TOP, 190)
          .Set(Am_FILL_STYLE, Am_Motif_Light_Green)
          .Set(Am_LEAVE_ROOM_FOR_FRINGE, false)
          .Get_Object(Am_COMMAND)
          .Set(Am_LABEL, "Generalize")
          .Set(Am_DO_METHOD, am_pop_up_generalize_from_button)
          .Set(Am_ACTIVE, am_generalize_script_active)
          .Get_Owner());
  Am_Object sg;
  am_invoke_window.Add_Part(
      Am_UNDO_SCROLL_GROUP,
      sg = Am_Scrolling_Menu.Create(DSTR("cmds_in_script"))
               .Set(Am_LEFT, 15)
               .Set(Am_TOP, Am_Bottom_Of_Sibling(Am_BEFORE_OR_AFTER, 5))
               .Set(Am_WIDTH, Am_From_Owner(Am_WIDTH, -34))
               .Set(Am_HEIGHT, Am_Rest_Of_Height_Above(Am_UNDO_OPTIONS, 15))
               .Set(Am_FILL_STYLE, Am_Motif_Light_Green)
               .Set(Am_H_SCROLL_BAR, true)
               .Add_Part(
                   Am_INTERACTOR,
                   Am_One_Shot_Interactor.Create(DSTR("select_line_part"))
                       .Set(Am_START_WHEN, Am_Input_Char("left_down"))
                       .Set(Am_PRIORITY, 10.0)
                       .Set(Am_START_WHERE_TEST,
                            am_on_selectable_match_line_part)
                       .Get_Object(Am_COMMAND)
                       .Set(Am_DO_METHOD, am_select_line_part)
                       .Set(Am_IMPLEMENTATION_PARENT, Am_NOT_USUALLY_UNDONE)
                       .Get_Owner())
               .Add_Part(
                   Am_ARROW_INTERACTOR,
                   Am_One_Shot_Interactor.Create(DSTR("double_clk"))
                       .Set(Am_START_WHEN, Am_Input_Char("double_left_down"))
                       .Set(Am_PRIORITY, 10.0)
                       .Set(Am_START_WHERE_TEST,
                            am_on_selectable_match_line_part)
                       .Get_Object(Am_COMMAND)
                       .Set(Am_DO_METHOD, am_generalize_match_double_click)
                       .Set(Am_IMPLEMENTATION_PARENT, Am_NOT_USUALLY_UNDONE)
                       .Get_Owner()));
  sg.Get_Object(Am_SUB_MENU)
      .Set(Am_V_SPACING, -4)
      .Set(Am_VISIBLE, menu_vis_if_before_after)
      .Set(Am_ACTIVE_2, false) //don't need to select the item in the menu
      .Get_Object(Am_ITEM_PROTOTYPE)
      .Set(Am_PRETEND_TO_BE_LEAF, false);
  sg.Get_Object(Am_COMMAND).Set(Am_DO_METHOD, am_clear_select_line_part);

  am_invoke_window.Add_Part(
      Am_UNDO_OPTIONS,
      Am_Button_Panel.Create(DSTR("OK-cancel"))
          .Set(Am_LEFT, Am_Center_X_Is_Center_Of_Owner)
          .Set(Am_BOTTOM_OFFSET, 10)
          .Set(Am_TOP, Am_Bottom_Is_Bottom_Of_Owner)
          .Set(Am_FILL_STYLE, Am_Motif_Light_Green)
          .Set(Am_LAYOUT, Am_Horizontal_Layout)
          .Set(Am_H_SPACING, 20)
          .Set(Am_V_SPACING, 0)
          .Set(Am_MAX_RANK, 0)
          .Set(Am_ITEMS, Am_Value_List()
                             .Add(Am_Standard_OK_Command.Create().Set(
                                 Am_DO_METHOD, am_invoke_ok))
                             .Add(Am_Standard_Cancel_Command.Create().Set(
                                 Am_DO_METHOD, am_invoke_cancel))));

  am_invoke_window.Add_Part(Am_Tab_To_Next_Widget_Interactor.Create());

  Am_Object accel_input_widget = am_invoke_window.Get_Object(Am_ACCELERATOR);
  accel_input_widget.Get_Object(Am_INTERACTOR)
      .Set_Name(DSTR("Get_Accel_Key_Inter"))
      .Set(Am_STOP_WHEN, (0L)) //stopped by single_char_method
      .Set(Am_TEXT_EDIT_METHOD, single_char_method);

  return am_invoke_window;
}